

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall CConnman::RemoveAddedNode(CConnman *this,string *strNode)

{
  pointer pAVar1;
  __type_conflict _Var2;
  const_iterator __position;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock88;
  unique_lock<std::mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_40,&this->m_added_nodes_mutex,
             "m_added_nodes_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0xdd7,false);
  __position._M_current =
       (this->m_added_node_params).
       super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
       super__Vector_impl_data._M_start;
  do {
    pAVar1 = (this->m_added_node_params).
             super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (__position._M_current == pAVar1) {
LAB_0071582f:
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return __position._M_current != pAVar1;
      }
      __stack_chk_fail();
    }
    _Var2 = std::operator==(strNode,&(__position._M_current)->m_added_node);
    if (_Var2) {
      std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::erase
                (&this->m_added_node_params,__position);
      goto LAB_0071582f;
    }
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

bool CConnman::RemoveAddedNode(const std::string& strNode)
{
    LOCK(m_added_nodes_mutex);
    for (auto it = m_added_node_params.begin(); it != m_added_node_params.end(); ++it) {
        if (strNode == it->m_added_node) {
            m_added_node_params.erase(it);
            return true;
        }
    }
    return false;
}